

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_X509.cpp
# Opt level: O0

size_t __thiscall axl::cry::X509Cert::savePem(X509Cert *this,String *string)

{
  int iVar1;
  BIO *bp;
  BUF_MEM *pBVar2;
  undefined4 extraout_var;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_RSI;
  undefined8 *in_RDI;
  BUF_MEM *mem;
  Bio bio;
  Bio *in_stack_ffffffffffffffb0;
  Handle local_18 [8];
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *local_10;
  
  local_10 = in_RSI;
  Bio::Bio((Bio *)0x1516c7);
  Bio::createMem(in_stack_ffffffffffffffb0);
  bp = (BIO *)sl::Handle::operator_cast_to_bio_st_(local_18);
  PEM_write_bio_X509(bp,(X509 *)*in_RDI);
  pBVar2 = Bio::getBufMem(in_stack_ffffffffffffffb0);
  iVar1 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
                    (local_10,(EVP_PKEY_CTX *)pBVar2->data,(EVP_PKEY_CTX *)pBVar2->length);
  Bio::~Bio((Bio *)0x151739);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t
X509Cert::savePem(sl::String* string) const {
	Bio bio;
	bio.createMem();
	PEM_write_bio_X509(bio, m_h);

	BUF_MEM* mem = bio.getBufMem();
	return string->copy(mem->data, mem->length);
}